

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  pointer pcVar1;
  cmMessenger *this_00;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  ostream *poVar5;
  bool bVar6;
  bool bVar7;
  Delimiter delim_local;
  cmListFileBacktrace lfbt;
  string local_210;
  cmListFileContext lfc;
  ostringstream m;
  
  delim_local = delim;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char*&,cmListFileArgument::Delimiter&,int&>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
             &(this->Function).Arguments,&token->text,&delim_local,&token->line);
  lVar4 = (long)token->column + -1;
  pcVar1 = (this->Function).Arguments.
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar1[-1].Col = lVar4;
  pcVar1[-1].LineEnd = (long)token->line;
  pcVar1[-1].ColEnd = (long)(int)lVar4 + (long)token->length;
  if (this->Separation == SeparationOkay) {
    bVar2 = true;
  }
  else {
    bVar6 = this->Separation != SeparationError;
    bVar7 = delim_local != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
    lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
    lfc.Name._M_string_length = 0;
    lfc.Name.field_2._M_local_buf[0] = '\0';
    lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
    lfc.FilePath._M_string_length = 0;
    lfc.FilePath.field_2._M_local_buf[0] = '\0';
    lfc.Line = 0;
    std::__cxx11::string::assign((char *)&lfc.FilePath);
    lfc.Line = (long)token->line;
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               &this->Backtrace);
    cmListFileBacktrace::Push((cmListFileBacktrace *)&local_210,(cmListFileContext *)&lfbt);
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               &local_210);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_210._M_string_length);
    poVar5 = std::operator<<((ostream *)&m,"Syntax ");
    bVar2 = bVar6 && bVar7;
    pcVar3 = "CMake Error";
    if (bVar6 && bVar7) {
      pcVar3 = "CMake Warning";
    }
    poVar5 = std::operator<<(poVar5,pcVar3 + 6);
    poVar5 = std::operator<<(poVar5," in cmake code at ");
    poVar5 = std::operator<<(poVar5,"column ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,token->column);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"Argument not separated from preceding token by whitespace.");
    this_00 = this->Messenger;
    if (bVar6 && bVar7) {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(this_00,AUTHOR_WARNING,&local_210,&lfbt);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_210,&lfbt);
    }
    std::__cxx11::string::~string((string *)&local_210);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lfbt.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmListFileContext::~cmListFileContext(&lfc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m);
  }
  return bVar2;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  this->Function.Arguments.emplace_back(token->text, delim, token->line);
  this->Function.Arguments.back().Col = token->column - 1;
  this->Function.Arguments.back().LineEnd =
    token->line; // TODO do multiline args exist?
  this->Function.Arguments.back().ColEnd =
    token->column - 1 + token->length; // TODO do multiline args exist?
  if (this->Separation == SeparationOkay) {
    return true;
  }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = token->line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);

  m << "Syntax " << (isError ? "Error" : "Warning") << " in cmake code at "
    << "column " << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  /* clang-format on */
  if (isError) {
    this->Messenger->IssueMessage(MessageType::FATAL_ERROR, m.str(), lfbt);
    return false;
  }
  this->Messenger->IssueMessage(MessageType::AUTHOR_WARNING, m.str(), lfbt);
  return true;
}